

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O3

void __thiscall ADS::Graph<unsigned_int>::empty(Graph<unsigned_int> *this)

{
  Node<ADS::Edge<unsigned_int>_*> *pNVar1;
  Node<ADS::Edge<unsigned_int>_*> *pNVar2;
  Edge<unsigned_int> *pEVar3;
  Vertex<unsigned_int> *pVVar4;
  uint uiIndex;
  
  if ((this->_vertices)._uiLen != 0) {
    uiIndex = 0;
    do {
      pVVar4 = DArray<ADS::Vertex<unsigned_int>_*>::get(&this->_vertices,uiIndex);
      if (pVVar4 != (Vertex<unsigned_int> *)0x0) {
        (this->_vertices)._pDArray[uiIndex - (this->_vertices)._uiOff] = (Vertex<unsigned_int> *)0x0
        ;
        while (pNVar1 = (pVVar4->edges)._pRoot, pNVar1 != (Node<ADS::Edge<unsigned_int>_*> *)0x0) {
          pNVar2 = pNVar1->pRightSibling;
          (pVVar4->edges)._pRoot = pNVar2;
          if ((pVVar4->edges)._pGetNext == pNVar1) {
            (pVVar4->edges)._pGetNext = pNVar2;
          }
          pEVar3 = pNVar1->el;
          (*pNVar1->_vptr_Node[1])();
          if (pEVar3 == (Edge<unsigned_int> *)0x0) break;
          operator_delete(pEVar3);
        }
      }
      operator_delete(pVVar4);
      uiIndex = uiIndex + 1;
    } while (uiIndex < (this->_vertices)._uiLen);
  }
  this->_uiNVertexes = 0;
  this->_uiNEdges = 0;
  return;
}

Assistant:

void Graph<T>::empty()
    {
        for (unsigned int i = 0; i < _vertices.size(); i++) {
            Vertex<T> *pVertex = _vertices.remove (i);
            if (pVertex != NULL) {
                for (Edge<T> *pEdge = pVertex->edges.pop(); pEdge != NULL;
                     pEdge = pVertex->edges.pop())
                    delete pEdge;
            }
            delete pVertex;
        }
        _uiNVertexes = 0;
        _uiNEdges = 0;
    }